

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

ThisType * Gs::Matrix<float,_3UL,_3UL>::Identity(void)

{
  Matrix<float,_3UL,_3UL> *in_RDI;
  
  LoadIdentity(in_RDI);
  LoadIdentity(in_RDI);
  return in_RDI;
}

Assistant:

static ThisType Identity()
        {
            ThisType result;
            result.LoadIdentity();
            return result;
        }